

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabDisconnect(sqlite3 *db,Table *p)

{
  sqlite3 *pVTab_00;
  VTable *pVTab;
  VTable **ppVTab;
  Table *p_local;
  sqlite3 *db_local;
  
  pVTab = (VTable *)((long)&p->u + 0x10);
  while( true ) {
    if (pVTab->db == (sqlite3 *)0x0) {
      return;
    }
    if ((sqlite3 *)pVTab->db->pVfs == db) break;
    pVTab = (VTable *)&pVTab->db->nDb;
  }
  pVTab_00 = pVTab->db;
  pVTab->db = *(sqlite3 **)&pVTab_00->nDb;
  sqlite3VtabUnlock((VTable *)pVTab_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabDisconnect(sqlite3 *db, Table *p){
  VTable **ppVTab;

  assert( IsVirtual(p) );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3_mutex_held(db->mutex) );

  for(ppVTab=&p->u.vtab.p; *ppVTab; ppVTab=&(*ppVTab)->pNext){
    if( (*ppVTab)->db==db  ){
      VTable *pVTab = *ppVTab;
      *ppVTab = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      break;
    }
  }
}